

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absval.cpp
# Opt level: O0

int __thiscall ncnn::AbsVal::forward_inplace(AbsVal *this,Mat *bottom_top_blob)

{
  float *pfVar1;
  long in_RSI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff88;
  int local_70;
  Mat local_60;
  Mat *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 0x1c);
  local_18 = *(int *)(in_RSI + 0x20);
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = local_14 * local_18;
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    this_00 = &local_60;
    Mat::channel(in_stack_ffffffffffffff88,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff88 = (Mat *)Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x10ebbe);
    for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
      pfVar1 = (float *)((long)&in_stack_ffffffffffffff88->data + (long)local_70 * 4);
      if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
        *(float *)((long)&in_stack_ffffffffffffff88->data + (long)local_70 * 4) =
             -*(float *)((long)&in_stack_ffffffffffffff88->data + (long)local_70 * 4);
      }
    }
    local_30 = in_stack_ffffffffffffff88;
  }
  return 0;
}

Assistant:

int AbsVal::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0)
                ptr[i] = -ptr[i];
        }
    }

    return 0;
}